

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O2

size_t compressImpl(Encoder *e,size_t nlines,size_t *lenIn,u8 **strIn,size_t size,u8 *output,
                   size_t *lenOut,u8 **strOut,bool noSuffixOpt,bool avoidBranch,int simd)

{
  element_type *peVar1;
  bool avoidBranch_00;
  ulong uVar2;
  bool noSuffixOpt_00;
  ulong uVar3;
  size_t sVar4;
  u8 uStack_2a9;
  u8 *puStack_2a8;
  u8 *puStack_2a0;
  size_t *psStack_298;
  u8 *puStack_290;
  size_t sStack_288;
  u8 **ppuStack_280;
  u8 *puStack_278;
  ulong uStack_270;
  anon_class_48_6_3eb800b7 aStack_268;
  u8 auStack_238 [520];
  
  peVar1 = (e->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puStack_2a8 = (u8 *)0x0;
  puStack_290 = (u8 *)0x0;
  puStack_278 = output + size;
  uStack_270 = (ulong)peVar1->suffixLim;
  uStack_2a9 = (peVar1->zeroTerminated + (char)peVar1->nSymbols) - (char)peVar1->lenHisto[0];
  sVar4 = 0;
  puStack_2a0 = output;
  psStack_298 = lenIn;
  ppuStack_280 = strIn;
  switchD_014c3389::default(auStack_238,0,0x207);
  aStack_268.cur = &puStack_2a8;
  aStack_268.end = &puStack_290;
  aStack_268.suffixLim = &uStack_270;
  aStack_268.out = &puStack_2a0;
  sStack_288 = nlines;
  aStack_268.symbolTable = peVar1;
  aStack_268.byteLim = &uStack_2a9;
  do {
    if (sVar4 == sStack_288) {
      return sStack_288;
    }
    strOut[sVar4] = output;
    uVar2 = psStack_298[sVar4];
    uVar3 = 0;
    do {
      puStack_2a8 = ppuStack_280[sVar4] + uVar3;
      uVar2 = uVar2 - uVar3;
      if (0x1fe < uVar2) {
        uVar2 = 0x1ff;
      }
      if ((ulong)((long)puStack_278 - (long)puStack_2a0) < (uVar2 & 0xffffffff) * 2 + 7) {
        return sVar4;
      }
      switchD_01939fa4::default(auStack_238,puStack_2a8,uVar2);
      puStack_290 = auStack_238 + uVar2;
      *puStack_290 = (u8)peVar1->terminator;
      if (noSuffixOpt) {
        noSuffixOpt_00 = true;
LAB_01e9fdd4:
        avoidBranch_00 = false;
      }
      else {
        noSuffixOpt_00 = false;
        if (!avoidBranch) goto LAB_01e9fdd4;
        avoidBranch_00 = true;
      }
      puStack_2a8 = auStack_238;
      compressBulk::anon_class_48_6_3eb800b7::operator()(&aStack_268,noSuffixOpt_00,avoidBranch_00);
      uVar3 = uVar3 + uVar2;
      uVar2 = psStack_298[sVar4];
    } while (uVar3 < uVar2);
    lenOut[sVar4] = (long)puStack_2a0 - (long)strOut[sVar4];
    sVar4 = sVar4 + 1;
    output = puStack_2a0;
  } while( true );
}

Assistant:

inline size_t _compressImpl(Encoder *e, size_t nlines, size_t lenIn[], u8 *strIn[], size_t size, u8 *output, size_t *lenOut, u8 *strOut[], bool noSuffixOpt, bool avoidBranch, int) {
	return compressBulk(*e->symbolTable, nlines, lenIn, strIn, size, output, lenOut, strOut, noSuffixOpt, avoidBranch);
}